

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdebug.cpp
# Opt level: O0

void __thiscall QDebug::putTimeUnit(QDebug *this,qint64 num,qint64 den)

{
  long lVar1;
  long in_FS_OFFSET;
  qint64 in_stack_000000a8;
  qint64 in_stack_000000b0;
  QByteArray *in_stack_ffffffffffffffe0;
  QTextStream *in_stack_ffffffffffffffe8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  timeUnit(in_stack_000000b0,in_stack_000000a8);
  QTextStream::operator<<(in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
  QByteArray::~QByteArray((QByteArray *)0x278566);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDebug::putTimeUnit(qint64 num, qint64 den)
{
    stream->ts << timeUnit(num, den); // ### optimize
}